

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::ConvolutionLayer2D
          (ConvolutionLayer2D<3UL> *this,size_t imageWidth,size_t imageHeight,Array *weights,
          Array *bias)

{
  size_t sVar1;
  valarray<float> *pvVar2;
  float *pfVar3;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001a46c8;
  this->inputWidth = imageWidth;
  this->inputHeight = imageHeight;
  this->inputSize = imageHeight * imageWidth;
  this->outputWidth = imageWidth - 2;
  this->outputHeight = imageHeight - 2;
  this->outputSize = (imageHeight - 2) * (imageWidth - 2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar1 = weights->_M_size;
  pvVar2->_M_size = sVar1;
  pfVar3 = (float *)operator_new(sVar1 << 2);
  pvVar2->_M_data = pfVar3;
  if (weights->_M_data != (float *)0x0) {
    memcpy(pfVar3,weights->_M_data,pvVar2->_M_size << 2);
  }
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar1 = bias->_M_size;
  pvVar2->_M_size = sVar1;
  pfVar3 = (float *)operator_new(sVar1 << 2);
  pvVar2->_M_data = pfVar3;
  if (bias->_M_data != (float *)0x0) {
    memcpy(pfVar3,bias->_M_data,pvVar2->_M_size << 2);
  }
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar2);
  sVar1 = this->outputSize;
  (this->localGrad)._M_size = sVar1;
  pfVar3 = (float *)operator_new(sVar1 * 4);
  (this->localGrad)._M_data = pfVar3;
  if (sVar1 != 0) {
    memset(pfVar3,0,sVar1 * 4);
  }
  pvVar2 = (valarray<float> *)operator_new(0x10);
  pvVar2->_M_size = 9;
  pfVar3 = (float *)operator_new(0x24);
  pvVar2->_M_data = pfVar3;
  pfVar3[4] = 0.0;
  pfVar3[5] = 0.0;
  pfVar3[6] = 0.0;
  pfVar3[7] = 0.0;
  pfVar3[0] = 0.0;
  pfVar3[1] = 0.0;
  pfVar3[2] = 0.0;
  pfVar3[3] = 0.0;
  pfVar3[8] = 0.0;
  (this->weightSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weightSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  pvVar2->_M_size = 1;
  pfVar3 = (float *)operator_new(4);
  pvVar2->_M_data = pfVar3;
  *pfVar3 = 0.0;
  (this->biasSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->biasSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar2);
  sVar1 = this->inputSize;
  (this->propagatedErrors)._M_size = sVar1;
  pfVar3 = (float *)operator_new(sVar1 * 4);
  (this->propagatedErrors)._M_data = pfVar3;
  if (sVar1 != 0) {
    memset(pfVar3,0,sVar1 * 4);
  }
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (weights->_M_size ==
      ((this->weightSensitivity).
       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_size) {
    if (bias->_M_size ==
        ((this->biasSensitivity).
         super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_size) {
      return;
    }
    __assert_fail("bias.size() == biasSensitivity->size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6cc,
                  "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
                 );
  }
  __assert_fail("weights.size() == weightSensitivity->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x6cb,
                "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
               );
}

Assistant:

ConvolutionLayer2D(size_t imageWidth, size_t imageHeight,
                       const Array &weights, const Array &bias)
        : inputWidth(imageWidth), inputHeight(imageHeight),
          inputSize(inputWidth * inputHeight),
          outputWidth(imageWidth - kernelSize + 1),
          outputHeight(imageHeight - kernelSize + 1),
          outputSize(outputWidth * outputHeight),
          weights(new Array(weights)),
          bias(new Array(bias)),
          localGrad(0.0, outputSize),
          weightSensitivity(new Array(0.0, kernelSize*kernelSize)),
          biasSensitivity(new Array(0.0, 1)),
          propagatedErrors(0.0, inputSize) {
              assert(weights.size() == weightSensitivity->size());
              assert(bias.size() == biasSensitivity->size());
          }